

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O2

void __thiscall
Jinx::Impl::Runtime::RegisterFunction
          (Runtime *this,FunctionSignature *signature,BufferPtr *bytecode,size_t offset)

{
  shared_ptr<Jinx::Impl::FunctionDefinition> functionDefPtr;
  __shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2> _Stack_58;
  pair<unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>_> local_48;
  size_t local_30;
  
  local_30 = offset;
  std::mutex::lock(&this->m_functionMutex);
  std::__shared_ptr<Jinx::Impl::FunctionDefinition,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Jinx::Allocator<Jinx::Impl::FunctionDefinition>,Jinx::Impl::FunctionSignature_const&,std::shared_ptr<Jinx::Buffer>const&,unsigned_long&>
            ((__shared_ptr<Jinx::Impl::FunctionDefinition,(__gnu_cxx::_Lock_policy)2> *)&_Stack_58,
             (Allocator<Jinx::Impl::FunctionDefinition> *)&local_48,signature,bytecode,&local_30);
  local_48.first = signature->m_id;
  std::__shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48.second.
              super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>,
             &_Stack_58);
  std::
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<Jinx::Impl::FunctionDefinition>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<Jinx::Impl::FunctionDefinition>>>,std::less<unsigned_long>,Jinx::StaticAllocator<std::pair<unsigned_long_const,std::shared_ptr<Jinx::Impl::FunctionDefinition>>,4096ul,16ul>>
  ::_M_emplace_unique<std::pair<unsigned_long,std::shared_ptr<Jinx::Impl::FunctionDefinition>>>
            ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<Jinx::Impl::FunctionDefinition>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<Jinx::Impl::FunctionDefinition>>>,std::less<unsigned_long>,Jinx::StaticAllocator<std::pair<unsigned_long_const,std::shared_ptr<Jinx::Impl::FunctionDefinition>>,4096ul,16ul>>
              *)&this->m_functionMap,&local_48);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_48.second.
              super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_58._M_refcount);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_functionMutex);
  return;
}

Assistant:

inline void Runtime::RegisterFunction(const FunctionSignature & signature, const BufferPtr & bytecode, size_t offset)
	{
		std::lock_guard<std::mutex> lock(m_functionMutex);
		auto functionDefPtr = std::allocate_shared<FunctionDefinition>(Allocator<FunctionDefinition>(), signature, bytecode, offset);
		m_functionMap.insert(std::make_pair(signature.GetId(), functionDefPtr));
	}